

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack.cpp
# Opt level: O3

bool goodform::msgpack::serialize(any *v,ostream *output)

{
  byte bVar1;
  float fVar2;
  int iVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *pmVar7;
  long *plVar8;
  _Base_ptr p_Var9;
  vector<std::any,_std::allocator<std::any>_> *pvVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  vector<char,_std::allocator<char>_> *pvVar12;
  float *pfVar13;
  double *pdVar14;
  uchar *puVar15;
  unsigned_short *puVar16;
  unsigned_long *puVar17;
  char *pcVar18;
  ushort *puVar19;
  uint *puVar20;
  ulong *puVar21;
  ushort uVar22;
  uint uVar23;
  ulong uVar24;
  any *paVar25;
  char cVar26;
  _Rb_tree_header *p_Var27;
  pointer v_00;
  pointer pcVar28;
  long lVar29;
  any key;
  uint16_t sz_be_6;
  any local_48;
  uint local_34;
  
  bVar5 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                    (v);
  cVar26 = (char)output;
  if ((bVar5) &&
     (pmVar7 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                         (v), (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count < 0x10)) {
    get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
              (v);
    plVar8 = (long *)std::ostream::put(cVar26);
    if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) != 0) {
      return false;
    }
    pmVar7 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                       (v);
    p_Var9 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var27 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 == p_Var27) {
      return true;
    }
    do {
      local_48._M_manager =
           std::any::
           _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::_S_manage;
      local_48._M_storage._M_ptr = (void *)0x0;
      std::any::_Manager_external<std::__cxx11::string>::_S_create<std::__cxx11::string_const&>
                (&local_48._M_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var9 + 1));
      bVar5 = serialize(&local_48,output);
      if (bVar5) {
        bVar5 = serialize((any *)(p_Var9 + 2),output);
      }
      else {
        bVar5 = false;
      }
      if (local_48._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
        (*local_48._M_manager)(_Op_destroy,&local_48,(_Arg *)0x0);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var27);
    return bVar5;
  }
  bVar5 = is<std::vector<std::any,std::allocator<std::any>>>(v);
  if ((bVar5) &&
     (pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v),
     (ulong)((long)(pvVar10->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(pvVar10->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
                  super__Vector_impl_data._M_start) < 0x100)) {
    get<std::vector<std::any,std::allocator<std::any>>>(v);
    plVar8 = (long *)std::ostream::put(cVar26);
    if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) != 0) {
      return false;
    }
    pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v);
    v_00 = (pvVar10->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
           super__Vector_impl_data._M_start;
    if (v_00 == (pvVar10->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
      return true;
    }
    do {
      bVar5 = serialize(v_00,output);
      v_00 = v_00 + 1;
    } while (v_00 != (pvVar10->super__Vector_base<std::any,_std::allocator<std::any>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
    return bVar5;
  }
  bVar5 = is<std::__cxx11::string>(v);
  if ((bVar5) && (pbVar11 = get<std::__cxx11::string>(v), pbVar11->_M_string_length < 0x20)) {
    get<std::__cxx11::string>(v);
    plVar8 = (long *)std::ostream::put(cVar26);
    if (*(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) != 0) {
      return false;
    }
    pbVar11 = get<std::__cxx11::string>(v);
    paVar25 = (any *)(pbVar11->_M_dataplus)._M_p;
    get<std::__cxx11::string>(v);
    goto LAB_0012dfe9;
  }
  bVar5 = is<decltype(nullptr)>(v);
  if (bVar5) {
LAB_0012dce0:
    std::ostream::put(cVar26);
    return true;
  }
  bVar5 = is<bool>(v);
  if (bVar5) {
    get<bool>(v);
    goto LAB_0012dce0;
  }
  bVar5 = is<std::vector<char,std::allocator<char>>>(v);
  if ((bVar5) &&
     (pvVar12 = get<std::vector<char,std::allocator<char>>>(v),
     (ulong)((long)(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start) < 0x100)) {
    plVar8 = (long *)std::ostream::put(cVar26);
    if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
      return false;
    }
    get<std::vector<char,std::allocator<char>>>(v);
    plVar8 = (long *)std::ostream::put(cVar26);
  }
  else {
    bVar5 = is<std::vector<char,std::allocator<char>>>(v);
    if ((bVar5) &&
       (pvVar12 = get<std::vector<char,std::allocator<char>>>(v),
       (ulong)((long)(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start) < 0x10000)) {
      pvVar12 = get<std::vector<char,std::allocator<char>>>(v);
      uVar22 = (short)*(undefined4 *)
                       &(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
               (short)*(undefined4 *)
                       &(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start;
      local_48._M_manager =
           (_func_void__Op_any_ptr__Arg_ptr *)
           CONCAT62(local_48._M_manager._2_6_,uVar22 * 0x100 | uVar22 >> 8);
      plVar8 = (long *)std::ostream::put(cVar26);
      bVar1 = *(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20);
    }
    else {
      bVar5 = is<std::vector<char,std::allocator<char>>>(v);
      if ((!bVar5) ||
         (pvVar12 = get<std::vector<char,std::allocator<char>>>(v),
         (ulong)((long)(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start) >> 0x20 != 0)) {
        bVar5 = is<float>(v);
        if (bVar5) {
          pfVar13 = get<float>(v);
          fVar2 = *pfVar13;
          local_48._M_manager =
               (_func_void__Op_any_ptr__Arg_ptr *)
               CONCAT44(local_48._M_manager._4_4_,
                        (uint)fVar2 >> 0x18 | ((uint)fVar2 & 0xff0000) >> 8 |
                        ((uint)fVar2 & 0xff00) << 8 | (int)fVar2 << 0x18);
LAB_0012def0:
          plVar8 = (long *)std::ostream::put(cVar26);
          iVar3 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20);
        }
        else {
          bVar5 = is<double>(v);
          if (bVar5) {
            pdVar14 = get<double>(v);
            dVar4 = *pdVar14;
            local_48._M_manager =
                 (_func_void__Op_any_ptr__Arg_ptr *)
                 ((ulong)dVar4 >> 0x38 | ((ulong)dVar4 & 0xff000000000000) >> 0x28 |
                  ((ulong)dVar4 & 0xff0000000000) >> 0x18 | ((ulong)dVar4 & 0xff00000000) >> 8 |
                  ((ulong)dVar4 & 0xff000000) << 8 | ((ulong)dVar4 & 0xff0000) << 0x18 |
                  ((ulong)dVar4 & 0xff00) << 0x28 | (long)dVar4 << 0x38);
LAB_0012df3a:
            plVar8 = (long *)std::ostream::put(cVar26);
            iVar3 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20);
          }
          else {
            bVar5 = is<unsigned_char>(v);
            if (bVar5) {
              puVar15 = get<unsigned_char>(v);
              local_48._M_manager =
                   (_func_void__Op_any_ptr__Arg_ptr *)CONCAT71(local_48._M_manager._1_7_,*puVar15);
LAB_0012df7f:
              plVar8 = (long *)std::ostream::put(cVar26);
              iVar3 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20);
            }
            else {
              bVar5 = is<unsigned_short>(v);
              if (bVar5) {
                puVar16 = get<unsigned_short>(v);
                local_48._M_manager =
                     (_func_void__Op_any_ptr__Arg_ptr *)
                     CONCAT62(local_48._M_manager._2_6_,*puVar16 << 8 | *puVar16 >> 8);
LAB_0012dfc7:
                plVar8 = (long *)std::ostream::put(cVar26);
                iVar3 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20);
              }
              else {
                bVar5 = is<unsigned_int>(v);
                if (bVar5) {
                  puVar17 = get<unsigned_long>(v);
                  uVar23 = (uint)*puVar17;
                  local_48._M_manager =
                       (_func_void__Op_any_ptr__Arg_ptr *)
                       CONCAT44(local_48._M_manager._4_4_,
                                uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                                uVar23 << 0x18);
                  goto LAB_0012def0;
                }
                bVar5 = is<unsigned_long>(v);
                if (bVar5) {
                  puVar17 = get<unsigned_long>(v);
                  uVar24 = *puVar17;
                  local_48._M_manager =
                       (_func_void__Op_any_ptr__Arg_ptr *)
                       (uVar24 >> 0x38 | (uVar24 & 0xff000000000000) >> 0x28 |
                        (uVar24 & 0xff0000000000) >> 0x18 | (uVar24 & 0xff00000000) >> 8 |
                        (uVar24 & 0xff000000) << 8 | (uVar24 & 0xff0000) << 0x18 |
                        (uVar24 & 0xff00) << 0x28 | uVar24 << 0x38);
                  goto LAB_0012df3a;
                }
                bVar5 = is<signed_char>(v);
                if (bVar5) {
                  pcVar18 = get<signed_char>(v);
                  local_48._M_manager =
                       (_func_void__Op_any_ptr__Arg_ptr *)
                       CONCAT71(local_48._M_manager._1_7_,*pcVar18);
                  goto LAB_0012df7f;
                }
                bVar5 = is<short>(v);
                if (bVar5) {
                  puVar19 = (ushort *)get<short>(v);
                  local_48._M_manager =
                       (_func_void__Op_any_ptr__Arg_ptr *)
                       CONCAT62(local_48._M_manager._2_6_,*puVar19 << 8 | *puVar19 >> 8);
                  goto LAB_0012dfc7;
                }
                bVar5 = is<int>(v);
                if (bVar5) {
                  puVar20 = (uint *)get<int>(v);
                  uVar23 = *puVar20;
                  local_48._M_manager =
                       (_func_void__Op_any_ptr__Arg_ptr *)
                       CONCAT44(local_48._M_manager._4_4_,
                                uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                                uVar23 << 0x18);
                  plVar8 = (long *)std::ostream::put(cVar26);
                  iVar3 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20);
                }
                else {
                  bVar5 = is<long>(v);
                  if (!bVar5) {
                    bVar5 = is<std::__cxx11::string>(v);
                    if ((bVar5) &&
                       (pbVar11 = get<std::__cxx11::string>(v), pbVar11->_M_string_length < 0x100))
                    {
                      plVar8 = (long *)std::ostream::put(cVar26);
                      if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
                        return false;
                      }
                      get<std::__cxx11::string>(v);
                      plVar8 = (long *)std::ostream::put(cVar26);
                    }
                    else {
                      bVar5 = is<std::__cxx11::string>(v);
                      if ((bVar5) &&
                         (pbVar11 = get<std::__cxx11::string>(v),
                         pbVar11->_M_string_length < 0x10000)) {
                        pbVar11 = get<std::__cxx11::string>(v);
                        uVar22 = (ushort)pbVar11->_M_string_length;
                        local_48._M_manager =
                             (_func_void__Op_any_ptr__Arg_ptr *)
                             CONCAT62(local_48._M_manager._2_6_,uVar22 << 8 | uVar22 >> 8);
                        plVar8 = (long *)std::ostream::put(cVar26);
                        bVar1 = *(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20);
                      }
                      else {
                        bVar5 = is<std::__cxx11::string>(v);
                        if ((!bVar5) ||
                           (pbVar11 = get<std::__cxx11::string>(v),
                           *(int *)((long)&pbVar11->_M_string_length + 4) != 0)) {
                          bVar5 = is<std::vector<std::any,std::allocator<std::any>>>(v);
                          if ((bVar5) &&
                             (pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v),
                             (ulong)((long)(pvVar10->
                                           super__Vector_base<std::any,_std::allocator<std::any>_>).
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pvVar10->
                                          super__Vector_base<std::any,_std::allocator<std::any>_>).
                                          _M_impl.super__Vector_impl_data._M_start) < 0x100000)) {
                            pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                            uVar22 = (ushort)((uint)(*(int *)&(pvVar10->
                                                                                                                            
                                                  super__Vector_base<std::any,_std::allocator<std::any>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  *(int *)&(pvVar10->
                                                                                                                      
                                                  super__Vector_base<std::any,_std::allocator<std::any>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 4);
                            local_48._M_manager =
                                 (_func_void__Op_any_ptr__Arg_ptr *)
                                 CONCAT62(local_48._M_manager._2_6_,uVar22 << 8 | uVar22 >> 8);
                            plVar8 = (long *)std::ostream::put(cVar26);
                            if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) !=
                                0) {
                              return false;
                            }
                            plVar8 = (long *)std::ostream::write((char *)output,(long)&local_48);
                            if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) !=
                                0) {
                              return false;
                            }
                            pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                            if ((pvVar10->super__Vector_base<std::any,_std::allocator<std::any>_>).
                                _M_impl.super__Vector_impl_data._M_finish ==
                                (pvVar10->super__Vector_base<std::any,_std::allocator<std::any>_>).
                                _M_impl.super__Vector_impl_data._M_start) {
                              return true;
                            }
                            uVar24 = 1;
                            lVar29 = 0;
                            do {
                              pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                              bVar5 = serialize((any *)((long)&((pvVar10->
                                                                                                                                
                                                  super__Vector_base<std::any,_std::allocator<std::any>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_manager + lVar29),output);
                              pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                              if ((ulong)((long)(pvVar10->
                                                super__Vector_base<std::any,_std::allocator<std::any>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pvVar10->
                                                super__Vector_base<std::any,_std::allocator<std::any>_>
                                                )._M_impl.super__Vector_impl_data._M_start >> 4) <=
                                  uVar24) {
                                return bVar5;
                              }
                              uVar24 = uVar24 + 1;
                              lVar29 = lVar29 + 0x10;
                            } while (bVar5);
                            return bVar5;
                          }
                          bVar5 = is<std::vector<std::any,std::allocator<std::any>>>(v);
                          if ((bVar5) &&
                             (pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v),
                             (ulong)((long)(pvVar10->
                                           super__Vector_base<std::any,_std::allocator<std::any>_>).
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pvVar10->
                                          super__Vector_base<std::any,_std::allocator<std::any>_>).
                                          _M_impl.super__Vector_impl_data._M_start) >> 0x24 == 0)) {
                            pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                            uVar23 = (uint)((ulong)((long)(pvVar10->
                                                                                                                    
                                                  super__Vector_base<std::any,_std::allocator<std::any>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pvVar10->
                                                                                                                
                                                  super__Vector_base<std::any,_std::allocator<std::any>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 4);
                            local_48._M_manager =
                                 (_func_void__Op_any_ptr__Arg_ptr *)
                                 CONCAT44(local_48._M_manager._4_4_,
                                          uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 |
                                          (uVar23 & 0xff00) << 8 | uVar23 << 0x18);
                            plVar8 = (long *)std::ostream::put(cVar26);
                            if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) !=
                                0) {
                              return false;
                            }
                            plVar8 = (long *)std::ostream::write((char *)output,(long)&local_48);
                            if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) !=
                                0) {
                              return false;
                            }
                            pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                            if ((pvVar10->super__Vector_base<std::any,_std::allocator<std::any>_>).
                                _M_impl.super__Vector_impl_data._M_finish ==
                                (pvVar10->super__Vector_base<std::any,_std::allocator<std::any>_>).
                                _M_impl.super__Vector_impl_data._M_start) {
                              return true;
                            }
                            uVar24 = 1;
                            lVar29 = 0;
                            do {
                              pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                              bVar5 = serialize((any *)((long)&((pvVar10->
                                                                                                                                
                                                  super__Vector_base<std::any,_std::allocator<std::any>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_manager + lVar29),output);
                              pvVar10 = get<std::vector<std::any,std::allocator<std::any>>>(v);
                              if ((ulong)((long)(pvVar10->
                                                super__Vector_base<std::any,_std::allocator<std::any>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pvVar10->
                                                super__Vector_base<std::any,_std::allocator<std::any>_>
                                                )._M_impl.super__Vector_impl_data._M_start >> 4) <=
                                  uVar24) {
                                return bVar5;
                              }
                              uVar24 = uVar24 + 1;
                              lVar29 = lVar29 + 0x10;
                            } while (bVar5);
                            return bVar5;
                          }
                          bVar5 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                            (v);
                          if ((bVar5) &&
                             (pmVar7 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                                 (v),
                             (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count < 0x10000))
                          {
                            pmVar7 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                               (v);
                            uVar22 = (ushort)(pmVar7->_M_t)._M_impl.super__Rb_tree_header.
                                             _M_node_count;
                            local_34 = CONCAT22(local_34._2_2_,uVar22 << 8 | uVar22 >> 8);
                            plVar8 = (long *)std::ostream::put(cVar26);
                            if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) !=
                                0) {
                              return false;
                            }
                            plVar8 = (long *)std::ostream::write((char *)output,(long)&local_34);
                            if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) !=
                                0) {
                              return false;
                            }
                            pmVar7 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                               (v);
                            p_Var9 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                            p_Var27 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
                            bVar5 = true;
                            if ((_Rb_tree_header *)p_Var9 == p_Var27) {
                              return true;
                            }
                            while( true ) {
                              local_48._M_manager =
                                   std::any::
                                   _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ::_S_manage;
                              local_48._M_storage._M_ptr = (void *)0x0;
                              std::any::_Manager_external<std::__cxx11::string>::
                              _S_create<std::__cxx11::string_const&>
                                        (&local_48._M_storage,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(p_Var9 + 1));
                              bVar6 = serialize(&local_48,output);
                              if ((!bVar6) ||
                                 (bVar6 = serialize((any *)(p_Var9 + 2),output), !bVar6)) {
                                bVar5 = false;
                              }
                              std::any::~any(&local_48);
                              p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
                              if ((_Rb_tree_header *)p_Var9 == p_Var27) break;
                              if (bVar5 == false) {
                                return false;
                              }
                            }
                            return bVar5;
                          }
                          bVar5 = is<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                            (v);
                          if (!bVar5) {
                            return false;
                          }
                          pmVar7 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                             (v);
                          if (*(int *)((long)&(pmVar7->_M_t)._M_impl.super__Rb_tree_header.
                                              _M_node_count + 4) != 0) {
                            return false;
                          }
                          pmVar7 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                             (v);
                          uVar23 = (uint)(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
                          local_34 = uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 |
                                     (uVar23 & 0xff00) << 8 | uVar23 << 0x18;
                          plVar8 = (long *)std::ostream::put(cVar26);
                          if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0
                             ) {
                            return false;
                          }
                          plVar8 = (long *)std::ostream::write((char *)output,(long)&local_34);
                          if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0
                             ) {
                            return false;
                          }
                          pmVar7 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                                             (v);
                          p_Var9 = (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                          p_Var27 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
                          bVar5 = true;
                          if ((_Rb_tree_header *)p_Var9 == p_Var27) {
                            return true;
                          }
                          while( true ) {
                            local_48._M_manager =
                                 std::any::
                                 _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ::_S_manage;
                            local_48._M_storage._M_ptr = (void *)0x0;
                            std::any::_Manager_external<std::__cxx11::string>::
                            _S_create<std::__cxx11::string_const&>
                                      (&local_48._M_storage,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(p_Var9 + 1));
                            bVar6 = serialize(&local_48,output);
                            if ((!bVar6) || (bVar6 = serialize((any *)(p_Var9 + 2),output), !bVar6))
                            {
                              bVar5 = false;
                            }
                            std::any::~any(&local_48);
                            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
                            if ((_Rb_tree_header *)p_Var9 == p_Var27) break;
                            if (bVar5 == false) {
                              return false;
                            }
                          }
                          return bVar5;
                        }
                        pbVar11 = get<std::__cxx11::string>(v);
                        uVar23 = (uint)pbVar11->_M_string_length;
                        local_48._M_manager =
                             (_func_void__Op_any_ptr__Arg_ptr *)
                             CONCAT44(local_48._M_manager._4_4_,
                                      uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 |
                                      (uVar23 & 0xff00) << 8 | uVar23 << 0x18);
                        plVar8 = (long *)std::ostream::put(cVar26);
                        bVar1 = *(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20);
                      }
                      if ((bVar1 & 5) != 0) {
                        return false;
                      }
                      plVar8 = (long *)std::ostream::write((char *)output,(long)&local_48);
                    }
                    if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
                      return false;
                    }
                    pbVar11 = get<std::__cxx11::string>(v);
                    pcVar28 = (pbVar11->_M_dataplus)._M_p;
                    get<std::__cxx11::string>(v);
                    goto LAB_0012de7f;
                  }
                  puVar21 = (ulong *)get<long>(v);
                  uVar24 = *puVar21;
                  local_48._M_manager =
                       (_func_void__Op_any_ptr__Arg_ptr *)
                       (uVar24 >> 0x38 | (uVar24 & 0xff000000000000) >> 0x28 |
                        (uVar24 & 0xff0000000000) >> 0x18 | (uVar24 & 0xff00000000) >> 8 |
                        (uVar24 & 0xff000000) << 8 | (uVar24 & 0xff0000) << 0x18 |
                        (uVar24 & 0xff00) << 0x28 | uVar24 << 0x38);
                  plVar8 = (long *)std::ostream::put(cVar26);
                  iVar3 = *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20);
                }
              }
            }
          }
        }
        paVar25 = &local_48;
        if (iVar3 != 0) {
          return false;
        }
LAB_0012dfe9:
        plVar8 = (long *)std::ostream::write((char *)output,(long)paVar25);
        return *(int *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) == 0;
      }
      pvVar12 = get<std::vector<char,std::allocator<char>>>(v);
      uVar23 = *(int *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
               *(int *)&(pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_start;
      local_48._M_manager =
           (_func_void__Op_any_ptr__Arg_ptr *)
           CONCAT44(local_48._M_manager._4_4_,
                    uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                    uVar23 * 0x1000000);
      plVar8 = (long *)std::ostream::put(cVar26);
      bVar1 = *(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20);
    }
    if ((bVar1 & 5) != 0) {
      return false;
    }
    plVar8 = (long *)std::ostream::write((char *)output,(long)&local_48);
  }
  if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
    return false;
  }
  pvVar12 = get<std::vector<char,std::allocator<char>>>(v);
  pcVar28 = (pvVar12->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  get<std::vector<char,std::allocator<char>>>(v);
LAB_0012de7f:
  plVar8 = (long *)std::ostream::write((char *)output,(long)pcVar28);
  if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0) {
    return true;
  }
  return false;
}

Assistant:

bool msgpack::serialize(const any& v, std::ostream& output)
  {
    bool ret = true;

    if (is<object_t>(v) && get<object_t>(v).size() <= 15) // fixmap	1000xxxx
    {
      ret = output.put(static_cast<char>(0x80 | (0x0F & get<object_t>(v).size()))).good();
      if (ret)
      {
        const goodform::object_t& tmp = get<object_t>(v);
        for (auto it = tmp.begin(); it != tmp.end(); ++it)
        {
          any key = it->first;
          ret = msgpack::serialize(key, output);
          if (ret)
            ret = msgpack::serialize(it->second, output);
        }
      }
    }
    else if (is<array_t>(v) && get<array_t>(v).size() <= 15) // fixarray	1001xxxx
    {
      ret = output.put(static_cast<char>(0x90 | (0x0F & get<array_t>(v).size()))).good();
      if (ret)
      {
        const goodform::array_t& tmp = get<array_t>(v);
        for (auto it = tmp.begin(); it != tmp.end(); ++it)
        {
          ret = msgpack::serialize(*it, output);
        }
      }
    }
    else if (is<std::string>(v) && get<std::string>(v).size() <= 31) // fixstr	101xxxxx
    {
      ret = output.put(static_cast<char>(0xA0 | (0x1F & get<std::string>(v).size()))).good();
      if (ret)
      {
        ret = output.write(&(get<std::string>(v)[0]), get<std::string>(v).size()).good();
      }
    }
    else if (is<std::nullptr_t>(v))
    {
      output.put(static_cast<char>(0xC0));
    }
    else if (is<bool>(v))
    {
      if (get<bool>(v))
        output.put(static_cast<char>(0xC3));
      else
        output.put(static_cast<char>(0xC2));
    }
    else if (is<binary_t>(v) && get<binary_t>(v).size() <= 0xFF) // Bin 8
    {
      if (!output.put(static_cast<char>(0xC4))
        || !output.put(static_cast<char>(0xFF & get<binary_t>(v).size()))
        || !output.write(get<binary_t>(v).data(), get<binary_t>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<binary_t>(v) && get<binary_t>(v).size() <= 0xFFFF) // Bin 16
    {
      std::uint16_t sz_be(htobe16(0xFFFF & get<binary_t>(v).size()));
      if (!output.put(static_cast<char>(0xC5))
        || !output.write((char*)(&sz_be), sizeof(sz_be))
        || !output.write(get<binary_t>(v).data(), get<binary_t>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<binary_t>(v) && get<binary_t>(v).size() <= 0xFFFFFFFF) // Bin 32
    {
      std::uint32_t sz_be(htobe32(0xFFFFFFFF & get<binary_t>(v).size()));
      if (!output.put(static_cast<char>(0xC6))
        || !output.write((char*)(&sz_be), sizeof(sz_be))
        || !output.write(get<binary_t>(v).data(), get<binary_t>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<float>(v))
    {
      float flt = get<float>(v);

      numeric_union32 nu;
      nu.f = static_cast<float>(flt);
      std::uint32_t be(htobe32(nu.i));
      ret = output.put(static_cast<char>(0xCA)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<double>(v))
    {
      double dbl = get<double>(v);
      numeric_union64 nu;
      nu.f = dbl;
      std::uint64_t be(htobe64(nu.i));
      ret = output.put(static_cast<char>(0xCB)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
      // IGNORING fixint types for now.
//    else if (v.type() == variant_type::unsigned_integer && v.get<std::uint64_t>() <= 0x7F) // positive fixint 0xxxxxxx
//    {
//      std::uint8_t val = static_cast<std::uint8_t>(v.get<std::uint64_t>());
//      ret = output.put(static_cast<char>(std::uint8_t(0x7F) & val)).good();
//    }
//    else if (v.type() == variant_type::signed_integer && v.get<std::int64_t>() < 0 && v.get<std::int64_t>() >= -31) // negative fixint	111xxxxx
//    {
//      std::int8_t val = static_cast<std::int8_t>(v.get<std::int64_t>());
//      ret = output.put(static_cast<char>(0xE0 | (0x1F & (val * -1)))).good();
//    }
    else if (is<std::uint8_t>(v)) // Uint 8
    {
      std::uint8_t val = get<std::uint8_t>(v);
      ret = output.put(static_cast<char>(0xCC)).good();
      if (ret)
        ret = output.write((char*)&val, sizeof(std::uint8_t)).good();
    }
    else if (is<std::uint16_t>(v)) // Uint 16
    {
      std::uint16_t val = get<std::uint16_t>(v);
      std::uint16_t be(htobe16(val));
      ret = output.put(static_cast<char>(0xCD)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::uint32_t>(v)) // Uint 32
    {
      std::uint32_t val = get<std::uint64_t>(v);
      std::uint32_t be(htobe32(val));
      ret = output.put(static_cast<char>(0xCE)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::uint64_t>(v)) // Uint 64
    {
      std::uint64_t be(htobe64(get<std::uint64_t>(v)));
      ret = output.put(static_cast<char>(0xCF)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::int8_t>(v)) // Int 8
    {
      std::int8_t val = get<std::int8_t>(v);
      ret = output.put(static_cast<char>(0xD0)).good();
      if (ret)
        ret = output.write((char*)&val, sizeof(std::int8_t)).good();
    }
    else if (is<std::int16_t>(v)) // Int 16
    {
      std::int16_t val = get<std::int16_t>(v);
      std::int16_t be(htobe16(val));
      ret = output.put(static_cast<char>(0xD1)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::int32_t>(v)) // Int 32
    {
      std::int32_t val = get<std::int32_t>(v);
      std::int32_t be(htobe32(val));
      ret = output.put(static_cast<char>(0xD2)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::int64_t>(v)) // Int 64
    {
      std::int64_t be(htobe64(get<std::int64_t>(v)));
      ret = output.put(static_cast<char>(0xD3)).good();
      if (ret)
        ret = output.write((char*)&be, sizeof(be)).good();
    }
    else if (is<std::string>(v) && get<std::string>(v).size() <= 0xFF) // str 8
    {
      if (!output.put(static_cast<char>(0xD9))
        || !output.put(static_cast<char>(0xFF & get<std::string>(v).size()))
        || !output.write(get<std::string>(v).data(), get<std::string>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<std::string>(v) && get<std::string>(v).size() <= 0xFFFF) // str 16
    {
      std::uint16_t sz_be(htobe16(0xFFFF & get<std::string>(v).size()));
      if (!output.put(static_cast<char>(0xDA))
        || !output.write((char*)(&sz_be), sizeof(sz_be))
        || !output.write(get<std::string>(v).data(), get<std::string>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<std::string>(v) && get<std::string>(v).size() <= 0xFFFFFFFF) // str 32
    {
      std::uint32_t sz_be(htobe32(0xFFFFFFFF & get<std::string>(v).size()));
      if (!output.put(static_cast<char>(0xDB))
        || !output.write((char*)(&sz_be), sizeof(sz_be))
        || !output.write(get<std::string>(v).data(), get<std::string>(v).size()))
      {
        ret = false;
      }
    }
    else if (is<array_t>(v) && get<array_t>(v).size() <= 0xFFFF) // array 16
    {
      std::uint16_t sz_be(htobe16(0xFFFF & get<array_t>(v).size()));
      if (!output.put(static_cast<char>(0xDC))
        || !output.write((char*)(&sz_be), sizeof(sz_be)))
      {
        ret = false;
      }
      else
      {
        for (size_t i = 0; i < get<array_t>(v).size() && ret; ++i)
          ret = msgpack::serialize(get<array_t>(v)[i], output);
      }
    }
    else if (is<array_t>(v) && get<array_t>(v).size() <= 0xFFFFFFFF) // array 32
    {
      std::uint32_t sz_be(htobe32(0xFFFFFFFF & get<array_t>(v).size()));
      if (!output.put(static_cast<char>(0xDD))
        || !output.write((char*)(&sz_be), sizeof(sz_be)))
      {
        ret = false;
      }
      else
      {
        for (size_t i = 0; i < get<array_t>(v).size() && ret; ++i)
          ret = msgpack::serialize(get<array_t>(v)[i], output);
      }
    }
    else if (is<object_t>(v) && get<object_t>(v).size() <= 0xFFFF) // map 16
    {
      std::uint16_t sz_be(htobe16(0xFFFF & get<object_t>(v).size()));
      if (!output.put(static_cast<char>(0xDE))
        || !output.write((char*)(&sz_be), sizeof(sz_be)))
      {
        ret = false;
      }
      else
      {
        const goodform::object_t& o = get<object_t>(v);
        for (auto it = o.begin(); it != o.end() && ret; ++it)
        {
          any key(it->first);
          if (!msgpack::serialize(key, output) || !msgpack::serialize(it->second, output))
          {
            ret = false;
          }
        }
      }
    }
    else if (is<object_t>(v) && get<object_t>(v).size() <= 0xFFFFFFFF) // map 32
    {
      std::uint32_t sz_be(htobe32(0xFFFFFFFF & get<object_t>(v).size()));
      if (!output.put(static_cast<char>(0xDF))
        || !output.write((char*)(&sz_be), sizeof(sz_be)))
      {
        ret = false;
      }
      else
      {
        const goodform::object_t& o = get<object_t>(v);
        for (auto it = o.begin(); it != o.end() && ret; ++it)
        {
          any key(it->first);
          if (!msgpack::serialize(key, output) || !msgpack::serialize(it->second, output))
          {
            ret = false;
          }
        }
      }
    }
    else
    {
      ret = false;
    }

    return ret;
  }